

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar6;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar7;
  value_type vVar8;
  
  vVar8 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (this->left_->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar6 = (this->left_->fadexpr_).right_;
  pFVar7 = (pFVar6->fadexpr_).left_;
  return vVar8 * ((double)(pFVar1->fadexpr_).left_.constant_ + pFVar3->val_ + pFVar2->val_) +
         (((double)(pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_) -
         ((pFVar6->fadexpr_).right_)->val_) *
         (((double)(pFVar5->fadexpr_).left_.constant_ + ((pFVar5->fadexpr_).right_)->val_) -
         ((pFVar4->fadexpr_).right_)->val_) *
         ((pFVar3->dx_).ptr_to_data[i] + (pFVar2->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}